

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O1

Code * __thiscall md::Code::jsr(Code *this,Param *target)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uchar local_41;
  uchar local_40;
  undefined7 uStack_3f;
  uchar *local_38;
  long local_30;
  
  iVar2 = (*target->_vptr_Param[1])(target);
  iVar3 = (**target->_vptr_Param)(target);
  iVar2 = iVar3 + iVar2 * 8 + 0x4e80;
  local_40 = (uchar)((uint)iVar2 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  local_40 = (uchar)iVar2;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  (*target->_vptr_Param[2])(&local_40,target);
  puVar4 = (uchar *)CONCAT71(uStack_3f,local_40);
  if (puVar4 != local_38) {
    do {
      local_41 = *puVar4;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_41);
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_38);
  }
  pvVar1 = (void *)CONCAT71(uStack_3f,local_40);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_30 - (long)pvVar1);
  }
  return this;
}

Assistant:

Code& Code::jsr(const Param& target)
{
    uint16_t opcode = 0x4E80 + target.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(target.getAdditionnalData());
    return *this;
}